

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

wchar_t player_get_next_place(wchar_t place,char *direction,wchar_t multiple)

{
  _Bool _Var1;
  int iVar2;
  level_conflict *plVar3;
  level_conflict *plVar4;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_44;
  level_conflict *local_40;
  level *lev;
  level *next_1;
  level *next;
  level *start;
  wchar_t next_place;
  wchar_t multiple_local;
  char *direction_local;
  wchar_t place_local;
  
  plVar3 = world->levels + place;
  if (plVar3 == (level_conflict *)0x0) {
    __assert_fail("start",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                  ,0x67,"int player_get_next_place(int, const char *, int)");
  }
  iVar2 = strcmp(direction,"north");
  if (iVar2 == 0) {
    if (plVar3->north == (char *)0x0) {
      local_44 = L'\xffffffff';
    }
    else {
      plVar3 = level_by_name(world,plVar3->north);
      local_44 = plVar3->index;
    }
    start._0_4_ = local_44;
  }
  else {
    iVar2 = strcmp(direction,"east");
    if (iVar2 == 0) {
      if (plVar3->east == (char *)0x0) {
        local_48 = L'\xffffffff';
      }
      else {
        plVar3 = level_by_name(world,plVar3->east);
        local_48 = plVar3->index;
      }
      start._0_4_ = local_48;
    }
    else {
      iVar2 = strcmp(direction,"south");
      if (iVar2 == 0) {
        if (plVar3->south == (char *)0x0) {
          local_4c = L'\xffffffff';
        }
        else {
          plVar3 = level_by_name(world,plVar3->south);
          local_4c = plVar3->index;
        }
        start._0_4_ = local_4c;
      }
      else {
        iVar2 = strcmp(direction,"west");
        if (iVar2 == 0) {
          if (plVar3->west == (char *)0x0) {
            local_50 = L'\xffffffff';
          }
          else {
            plVar3 = level_by_name(world,plVar3->west);
            local_50 = plVar3->index;
          }
          start._0_4_ = local_50;
        }
        else {
          iVar2 = strcmp(direction,"up");
          if (iVar2 == 0) {
            _Var1 = mountain_top_possible(place);
            if (_Var1) {
              plVar3 = level_by_name(world,"Mountain Top Town");
              start._0_4_ = plVar3->index;
            }
            else {
              if (plVar3->up == (char *)0x0) {
                local_54 = L'\xffffffff';
              }
              else {
                plVar3 = level_by_name(world,plVar3->up);
                local_54 = plVar3->index;
              }
              start._0_4_ = local_54;
            }
          }
          else {
            iVar2 = strcmp(direction,"down");
            start._0_4_ = place;
            if (iVar2 == 0) {
              _Var1 = underworld_possible(place);
              local_40 = plVar3;
              start._4_4_ = multiple;
              if (_Var1) {
                plVar3 = level_by_name(world,"Underworld Town");
                start._0_4_ = plVar3->index;
              }
              else {
                while ((start._4_4_ != L'\0' &&
                       (_Var1 = quest_forbid_downstairs(local_40->index), !_Var1))) {
                  if (local_40->down == (char *)0x0) {
                    local_58 = L'\xffffffff';
                  }
                  else {
                    plVar4 = level_by_name(world,local_40->down);
                    local_58 = plVar4->index;
                  }
                  start._0_4_ = local_58;
                  if (local_58 < L'\0') {
                    if (local_40 != plVar3) {
                      return local_40->index;
                    }
                    return L'\xffffffff';
                  }
                  start._4_4_ = start._4_4_ + L'\xffffffff';
                  local_40 = world->levels + local_58;
                }
              }
            }
          }
        }
      }
    }
  }
  return (wchar_t)start;
}

Assistant:

int player_get_next_place(int place, const char *direction, int multiple)
{
	int next_place = place;
	struct level *start = &world->levels[place];
	assert(start);

	/* Follow the given direction (possibly multiple times for down) */
	if (streq(direction, "north")) {
		next_place = start->north ?
			level_by_name(world, start->north)->index : -1;
	} else if (streq(direction, "east")) {
		next_place = start->east ?
			level_by_name(world, start->east)->index : -1;
	} else if (streq(direction, "south")) {
		next_place = start->south ?
			level_by_name(world, start->south)->index : -1;
	} else if (streq(direction, "west")) {
		next_place = start->west ?
			level_by_name(world, start->west)->index : -1;
	} else if (streq(direction, "up")) {
		if (mountain_top_possible(place)) {
			/* Find stupidly named level */
			struct level *next = level_by_name(world, "Mountain Top Town");
			next_place = next->index;
		} else {
			next_place = start->up ?
				level_by_name(world, start->up)->index : -1;
		}
	} else if (streq(direction, "down")) {
		if (underworld_possible(place)) {
			/* Find stupidly named level */
			struct level *next = level_by_name(world, "Underworld Town");
			next_place = next->index;
		} else {
			struct level *lev = start;
			while (multiple) {
				/* Stop at unfinished quest levels */
				if (quest_forbid_downstairs(lev->index)) break;

				/* Go down */
				next_place = lev->down ?
					level_by_name(world, lev->down)->index : -1;

				/* Check failures */
				if (next_place < 0) {
					/* If we've taken some steps use the last valid one */
					if (lev != start) {
						return lev->index;
					} else {
						return -1;
					}
				}
				lev = &world->levels[next_place];
				multiple--;
			}
		}
	}

	return next_place;
}